

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O1

void __thiscall xs::PosixTestProcess::cleanup(PosixTestProcess *this,EVP_PKEY_CTX *ctx)

{
  Process *this_00;
  deBool dVar1;
  int __sig;
  __pid_t __pid;
  
  __pid = (__pid_t)ctx;
  if ((this->m_caseListWriter).super_Thread.m_thread != 0) {
    (this->m_caseListWriter).m_run = false;
    de::Thread::join(&(this->m_caseListWriter).super_Thread);
    (this->m_caseListWriter).m_file = (deFile *)0x0;
  }
  posix::FileReader::stop(&this->m_logReader);
  (this->m_infoBuffer).m_canceled = 1;
  deSemaphore_increment((this->m_infoBuffer).m_empty);
  deSemaphore_increment((this->m_infoBuffer).m_fill);
  if ((this->m_stdErrReader).super_Thread.m_thread != 0) {
    de::Thread::join(&(this->m_stdErrReader).super_Thread);
    (this->m_stdErrReader).m_file = (deFile *)0x0;
  }
  if ((this->m_stdOutReader).super_Thread.m_thread != 0) {
    de::Thread::join(&(this->m_stdOutReader).super_Thread);
    (this->m_stdOutReader).m_file = (deFile *)0x0;
  }
  de::BlockBuffer<unsigned_char>::clear(&this->m_infoBuffer);
  if (this->m_process != (Process *)0x0) {
    dVar1 = deProcess_isRunning(this->m_process->m_process);
    if (dVar1 == 1) {
      de::Process::kill(this->m_process,__pid,__sig);
      de::Process::waitForFinish(this->m_process);
    }
    this_00 = this->m_process;
    if (this_00 != (Process *)0x0) {
      de::Process::~Process(this_00);
      operator_delete(this_00,8);
    }
    this->m_process = (Process *)0x0;
  }
  return;
}

Assistant:

void PosixTestProcess::cleanup (void)
{
	m_caseListWriter.stop();
	m_logReader.stop();

	// \note Info buffer must be canceled before stopping pipe readers.
	m_infoBuffer.cancel();

	m_stdErrReader.stop();
	m_stdOutReader.stop();

	// Reset info buffer.
	m_infoBuffer.clear();

	if (m_process)
	{
		try
		{
			if (m_process->isRunning())
			{
				m_process->kill();
				m_process->waitForFinish();
			}
		}
		catch (const de::ProcessError& e)
		{
			printf("PosixTestProcess::stop(): Failed to kill process: %s\n", e.what());
		}

		delete m_process;
		m_process = DE_NULL;
	}
}